

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-process-title.c
# Opt level: O2

int run_test_process_title(void)

{
  int iVar1;
  char *pcVar2;
  undefined8 uStack_210;
  undefined1 auStack_208 [520];
  
  set_title("%s%s%s%s%s%s%s%s%s%s%s%s%s%s%s%s%s%s%s");
  set_title("new title");
  iVar1 = uv_get_process_title(0,100);
  if (iVar1 == -0x16) {
    iVar1 = uv_get_process_title(auStack_208,0);
    if (iVar1 == -0x16) {
      iVar1 = uv_get_process_title(auStack_208,1);
      if (iVar1 == -0x69) {
        return 0;
      }
      pcVar2 = "r == UV_ENOBUFS";
      uStack_210 = 0x3a;
    }
    else {
      pcVar2 = "r == UV_EINVAL";
      uStack_210 = 0x36;
    }
  }
  else {
    pcVar2 = "r == UV_EINVAL";
    uStack_210 = 0x32;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-process-title.c"
          ,uStack_210,pcVar2);
  abort();
}

Assistant:

TEST_IMPL(process_title) {
#if defined(__sun) || defined(__CYGWIN__) || defined(__MSYS__) || \
    defined(__PASE__)
  RETURN_SKIP("uv_(get|set)_process_title is not implemented.");
#endif

  /* Check for format string vulnerabilities. */
  set_title("%s%s%s%s%s%s%s%s%s%s%s%s%s%s%s%s%s%s%s");
  set_title("new title");

  /* Check uv_get_process_title() edge cases */
  uv_get_process_title_edge_cases();

  return 0;
}